

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack10(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x16;
    out_local[1] = *in_local >> 0xc & 0x3ff;
    out_local[2] = *in_local >> 2 & 0x3ff;
    out_local[3] = (*in_local & 3) << 8;
    out_local[3] = in_local[1] >> 0x18 | out_local[3];
    out_local[4] = in_local[1] >> 0xe & 0x3ff;
    out_local[5] = in_local[1] >> 4 & 0x3ff;
    out_local[6] = (in_local[1] & 0xf) << 6;
    out_local[6] = in_local[2] >> 0x1a | out_local[6];
    out_local[7] = in_local[2] >> 0x10 & 0x3ff;
    out_local[8] = in_local[2] >> 6 & 0x3ff;
    out_local[9] = (in_local[2] & 0x3f) << 4;
    out_local[9] = in_local[3] >> 0x1c | out_local[9];
    out_local[10] = in_local[3] >> 0x12 & 0x3ff;
    out_local[0xb] = in_local[3] >> 8 & 0x3ff;
    out_local[0xc] = (in_local[3] & 0xff) << 2;
    out_local[0xc] = in_local[4] >> 0x1e | out_local[0xc];
    out_local[0xd] = in_local[4] >> 0x14 & 0x3ff;
    out_local[0xe] = in_local[4] >> 10 & 0x3ff;
    out_local[0xf] = in_local[4] & 0x3ff;
    out_local[0x10] = in_local[5] >> 0x16;
    out_local[0x11] = in_local[5] >> 0xc & 0x3ff;
    out_local[0x12] = in_local[5] >> 2 & 0x3ff;
    out_local[0x13] = (in_local[5] & 3) << 8;
    out_local[0x13] = in_local[6] >> 0x18 | out_local[0x13];
    out_local[0x14] = in_local[6] >> 0xe & 0x3ff;
    out_local[0x15] = in_local[6] >> 4 & 0x3ff;
    out_local[0x16] = (in_local[6] & 0xf) << 6;
    out_local[0x16] = in_local[7] >> 0x1a | out_local[0x16];
    out_local[0x17] = in_local[7] >> 0x10 & 0x3ff;
    out_local[0x18] = in_local[7] >> 6 & 0x3ff;
    out_local[0x19] = (in_local[7] & 0x3f) << 4;
    out_local[0x19] = in_local[8] >> 0x1c | out_local[0x19];
    out_local[0x1a] = in_local[8] >> 0x12 & 0x3ff;
    out_local[0x1b] = in_local[8] >> 8 & 0x3ff;
    out_local[0x1c] = (in_local[8] & 0xff) << 2;
    out_local[0x1c] = in_local[9] >> 0x1e | out_local[0x1c];
    out_local[0x1d] = in_local[9] >> 0x14 & 0x3ff;
    out_local[0x1e] = in_local[9] >> 10 & 0x3ff;
    out_local[0x1f] = in_local[9] & 0x3ff;
    out_local = out_local + 0x20;
    in_local = in_local + 10;
  }
  return;
}

Assistant:

void __vseblocks_unpack10(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 10, --bs) {
    out[0] = in[0] >> 22;
    out[1] = (in[0] >> 12) & 0x03ff;
    out[2] = (in[0] >> 2) & 0x03ff;
    out[3] = (in[0] << 8) & 0x03ff;
    out[3] |= in[1] >> 24;
    out[4] = (in[1] >> 14) & 0x03ff;
    out[5] = (in[1] >> 4) & 0x03ff;
    out[6] = (in[1] << 6) & 0x03ff;
    out[6] |= in[2] >> 26;
    out[7] = (in[2] >> 16) & 0x03ff;
    out[8] = (in[2] >> 6) & 0x03ff;
    out[9] = (in[2] << 4) & 0x03ff;
    out[9] |= in[3] >> 28;
    out[10] = (in[3] >> 18) & 0x03ff;
    out[11] = (in[3] >> 8) & 0x03ff;
    out[12] = (in[3] << 2) & 0x03ff;
    out[12] |= in[4] >> 30;
    out[13] = (in[4] >> 20) & 0x03ff;
    out[14] = (in[4] >> 10) & 0x03ff;
    out[15] = in[4] & 0x03ff;
    out[16] = in[5] >> 22;
    out[17] = (in[5] >> 12) & 0x03ff;
    out[18] = (in[5] >> 2) & 0x03ff;
    out[19] = (in[5] << 8) & 0x03ff;
    out[19] |= in[6] >> 24;
    out[20] = (in[6] >> 14) & 0x03ff;
    out[21] = (in[6] >> 4) & 0x03ff;
    out[22] = (in[6] << 6) & 0x03ff;
    out[22] |= in[7] >> 26;
    out[23] = (in[7] >> 16) & 0x03ff;
    out[24] = (in[7] >> 6) & 0x03ff;
    out[25] = (in[7] << 4) & 0x03ff;
    out[25] |= in[8] >> 28;
    out[26] = (in[8] >> 18) & 0x03ff;
    out[27] = (in[8] >> 8) & 0x03ff;
    out[28] = (in[8] << 2) & 0x03ff;
    out[28] |= in[9] >> 30;
    out[29] = (in[9] >> 20) & 0x03ff;
    out[30] = (in[9] >> 10) & 0x03ff;
    out[31] = in[9] & 0x03ff;
  }
}